

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fortran.c
# Opt level: O0

REF_STATUS
ref_fortran_import_face_(REF_INT *face_index,REF_INT *node_per_face,REF_INT *nface,REF_INT *f2n)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL has_a_local_node;
  REF_INT new_face;
  REF_INT node;
  REF_INT face;
  REF_CELL ref_cell;
  REF_INT *nodes;
  REF_NODE ref_node;
  REF_INT *f2n_local;
  REF_INT *nface_local;
  REF_INT *node_per_face_local;
  REF_INT *face_index_local;
  
  nodes = &ref_grid->node->n;
  ref_node = (REF_NODE)f2n;
  f2n_local = nface;
  nface_local = node_per_face;
  node_per_face_local = face_index;
  uVar2 = ref_grid_face_with(ref_grid,*node_per_face,(REF_CELL *)&node);
  if (uVar2 == 0) {
    if (*nface_local + 1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
             0x65,"ref_fortran_import_face_","malloc nodes of REF_INT negative");
      face_index_local._4_4_ = 1;
    }
    else {
      ref_cell = (REF_CELL)malloc((long)(*nface_local + 1) << 2);
      if (ref_cell == (REF_CELL)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
               0x65,"ref_fortran_import_face_","malloc nodes of REF_INT NULL");
        face_index_local._4_4_ = 2;
      }
      else if (ref_cell == (REF_CELL)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",
               0x66,"ref_fortran_import_face_","malloc nodes NULL");
        face_index_local._4_4_ = 2;
      }
      else {
        for (new_face = 0; new_face < *f2n_local; new_face = new_face + 1) {
          bVar3 = false;
          for (has_a_local_node = 0; has_a_local_node < *nface_local;
              has_a_local_node = has_a_local_node + 1) {
            (&ref_cell->type)[has_a_local_node] =
                 (&ref_node->n)[has_a_local_node + *nface_local * new_face] - REF_CELL_ED2;
            bVar1 = !bVar3;
            bVar3 = true;
            if (bVar1) {
              bVar3 = ref_grid->mpi->id ==
                      *(int *)(*(long *)(nodes + 10) +
                              (long)(int)(&ref_cell->type)[has_a_local_node] * 4);
            }
          }
          (&ref_cell->type)[*nface_local] = *node_per_face_local;
          if ((bVar3) &&
             (uVar2 = ref_cell_add(_node,(REF_INT *)ref_cell,&ref_private_macro_code_rss),
             uVar2 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c"
                   ,0x71,"ref_fortran_import_face_",(ulong)uVar2,"add face");
            return uVar2;
          }
        }
        free(ref_cell);
        face_index_local._4_4_ = 0;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fortran.c",99,
           "ref_fortran_import_face_",(ulong)uVar2,"get face");
    face_index_local._4_4_ = uVar2;
  }
  return face_index_local._4_4_;
}

Assistant:

REF_STATUS REF_FORT_(ref_fortran_import_face,
                     REF_FORTRAN_IMPORT_FACE)(REF_INT *face_index,
                                              REF_INT *node_per_face,
                                              REF_INT *nface, REF_INT *f2n) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *nodes;
  REF_CELL ref_cell;
  REF_INT face, node, new_face;
  REF_BOOL has_a_local_node;

  RSS(ref_grid_face_with(ref_grid, *node_per_face, &ref_cell), "get face");

  ref_malloc(nodes, (*node_per_face) + 1, REF_INT);
  RNS(nodes, "malloc nodes NULL");
  for (face = 0; face < (*nface); face++) {
    has_a_local_node = REF_FALSE;
    for (node = 0; node < (*node_per_face); node++) {
      nodes[node] = f2n[node + (*node_per_face) * face] - 1;
      has_a_local_node =
          has_a_local_node || (ref_mpi_rank(ref_grid_mpi(ref_grid)) ==
                               ref_node_part(ref_node, nodes[node]));
    }
    nodes[(*node_per_face)] = (*face_index);
    if (has_a_local_node)
      RSS(ref_cell_add(ref_cell, nodes, &new_face), "add face");
  }
  free(nodes);
  return REF_SUCCESS;
}